

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_lambda(sexp ctx,sexp x,int depth)

{
  sexp ctx_00;
  undefined1 auVar1 [16];
  undefined4 depth_00;
  int iVar2;
  undefined8 uVar3;
  sexp psVar4;
  undefined8 uVar5;
  sexp value_00;
  sexp psVar6;
  undefined8 uVar7;
  sexp psVar8;
  undefined4 in_EDX;
  undefined8 in_RSI;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver6;
  sexp ctx2;
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp defs;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp value;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp body;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp ctx3;
  sexp ls;
  sexp name;
  int verify_duplicates_p;
  int trailing_non_procs;
  sexp in_stack_ffffffffffffff18;
  uint7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar9;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar10;
  sexp ls_00;
  sexp_sint_t n;
  undefined8 self;
  undefined8 ctx_01;
  undefined8 uVar11;
  undefined8 self_00;
  undefined8 ctx_02;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined8 o;
  undefined1 local_58 [8];
  undefined8 object;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 uVar12;
  
  memset(&stack0xffffffffffffffb0,0,0x10);
  local_58 = (undefined1  [8])&DAT_0000043e;
  memset(&stack0xffffffffffffff98,0,0x10);
  o = &DAT_0000043e;
  memset(local_80,0,0x10);
  local_88 = &DAT_0000043e;
  memset(&stack0xffffffffffffff68,0,0x10);
  uVar11 = &DAT_0000043e;
  memset(&stack0xffffffffffffff50,0,0x10);
  n = 0x43e;
  memset(&stack0xffffffffffffff38,0,0x10);
  uVar7 = &stack0xffffffffffffffc0;
  object = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb0;
  uVar3 = local_58;
  uVar5 = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff98;
  local_80._0_8_ = &stack0xffffffffffffff90;
  local_80._8_8_ = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)local_80;
  self_00 = &stack0xffffffffffffff78;
  ctx_02 = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff68;
  self = &stack0xffffffffffffff60;
  ctx_01 = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff50;
  psVar8 = (sexp)&stack0xffffffffffffff48;
  ls_00 = (sexp)(in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff38;
  if ((((((ulong)*(sexp_conflict *)(in_RSI + 0x10) & 3) == 0) &&
       ((*(sexp_conflict *)(in_RSI + 0x10))->tag == 6)) &&
      ((((*(sexp_conflict *)(in_RSI + 0x10))->value).string.offset & 3) == 0)) &&
     ((((*(sexp_conflict *)(in_RSI + 0x10))->value).type.cpl)->tag == 6)) {
    psVar4 = sexp_length_op((sexp)0x0,(sexp)0x0,1,
                            ((*(sexp_conflict *)(in_RSI + 0x10))->value).type.name);
    auVar1._8_8_ = (long)psVar4 >> 0x3f;
    auVar1._0_8_ = (ulong)psVar4 & 0xfffffffffffffffe;
    depth_00 = ZEXT14(SUB168(auVar1 / SEXT816(2),0) < 100);
    local_30 = ((*(sexp_conflict *)(in_RSI + 0x10))->value).type.name;
    while( true ) {
      uVar10 = false;
      if ((local_30 & 3) == 0) {
        uVar10 = ((sexp)local_30)->tag == 6;
      }
      if ((bool)uVar10 == false) {
        if ((sexp)local_30 != (sexp)&DAT_0000023e) {
          iVar2 = sexp_idp((sexp)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
          if (iVar2 == 0) {
            uVar3 = sexp_compile_error((sexp)uVar5,(char *)uVar3,(sexp)o);
            goto LAB_00152b71;
          }
          psVar4 = sexp_memq_op(in_RDI,(sexp)0x0,2,(sexp)local_30,
                                ((*(sexp_conflict *)(in_RSI + 0x10))->value).type.name);
          if (psVar4 != (sexp)&DAT_0000003e) {
            uVar3 = sexp_compile_error((sexp)uVar5,(char *)uVar3,(sexp)o);
            goto LAB_00152b71;
          }
        }
        psVar4 = in_RDI;
        sexp_copy_list_op((sexp)ctx_01,(sexp)self,n,ls_00);
        uVar5 = sexp_make_lambda((sexp)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20)
                                 ,in_stack_ffffffffffffff18);
        if (((uVar5 & 3) == 0) && (uVar3 = uVar5, ((sexp)uVar5)->tag == 0x13)) goto LAB_00152b71;
        (((sexp)uVar5)->value).opcode.dl = *(sexp_conflict *)(in_RSI + 0x18);
        if (((((sexp)uVar5)->value).opcode.dl == (sexp)0x0) ||
           ((((ulong)(((sexp)uVar5)->value).opcode.dl & 3) != 0 ||
            (((((sexp)uVar5)->value).opcode.dl)->tag != 6)))) {
          (((sexp)uVar5)->value).opcode.dl = ((*(sexp_conflict *)(in_RSI + 0x10))->value).type.slots
          ;
        }
        if ((((((sexp)uVar5)->value).opcode.dl == (sexp)0x0) ||
            (((ulong)(((sexp)uVar5)->value).opcode.dl & 3) != 0)) ||
           (((((sexp)uVar5)->value).opcode.dl)->tag != 6)) {
          (((sexp)uVar5)->value).opcode.dl =
               ((((*(sexp_conflict *)(in_RSI + 0x10))->value).type.cpl)->value).type.slots;
        }
        value_00 = sexp_make_child_context
                             ((sexp)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
        if ((((ulong)value_00 & 3) == 0) && (uVar3 = value_00, value_00->tag == 0x13))
        goto LAB_00152b71;
        sexp_flatten_dot((sexp)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff18);
        psVar6 = sexp_extend_env((sexp)uVar11,(sexp)ctx_01,(sexp)self,value_00);
        (value_00->value).type.cpl = psVar6;
        if ((((value_00->value).string.offset & 3) == 0) &&
           (((value_00->value).type.cpl)->tag == 0x13)) {
          uVar3 = (value_00->value).type.cpl;
          goto LAB_00152b71;
        }
        (((value_00->value).type.cpl)->value).type.cpl = (sexp)uVar5;
        local_58 = (undefined1  [8])
                   analyze_seq((sexp)self,value_00,(int)((ulong)ls_00 >> 0x20),(int)ls_00);
        if ((((ulong)local_58 & 3) == 0) && (uVar3 = local_58, ((sexp)local_58)->tag == 0x13))
        goto LAB_00152b71;
        uVar12 = 0;
        uVar11 = &DAT_0000023e;
        local_30 = (((sexp)uVar5)->value).type.getters;
        goto LAB_001526ea;
      }
      iVar2 = sexp_idp((sexp)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      if (iVar2 == 0) {
        uVar3 = sexp_compile_error((sexp)uVar5,(char *)uVar3,(sexp)o);
        goto LAB_00152b71;
      }
      if ((depth_00 != 0) &&
         (psVar4 = sexp_memq_op(in_RDI,(sexp)0x0,2,(((sexp)local_30)->value).type.name,
                                (((sexp)local_30)->value).type.cpl), psVar4 != (sexp)&DAT_0000003e))
      break;
      local_30 = (((sexp)local_30)->value).type.cpl;
    }
    uVar3 = sexp_compile_error((sexp)uVar5,(char *)uVar3,(sexp)o);
  }
  else {
    uVar3 = sexp_compile_error((sexp)uVar5,(char *)uVar3,(sexp)o);
  }
LAB_00152b71:
  (in_RDI->value).context.saves = (sexp_gc_var_t *)object;
  return (sexp)uVar3;
LAB_001526ea:
  uVar9 = false;
  if ((local_30 & 3) == 0) {
    uVar9 = ((sexp)local_30)->tag == 6;
  }
  if ((bool)uVar9 == false) {
    if (((uVar11 & 3) == 0) && (((sexp)uVar11)->tag == 6)) {
      if ((((ulong)local_58 & 3) != 0) || (*(sexp_tag_t *)local_58 != 0x21)) {
        uVar7 = sexp_alloc_tagged_aux
                          ((sexp)CONCAT17(uVar10,in_stack_ffffffffffffff30),(size_t)psVar4,
                           (ulong)in_stack_ffffffffffffff20);
        psVar8 = sexp_cons_op(psVar8,(sexp)CONCAT17(uVar10,in_stack_ffffffffffffff30),
                              (sexp_sint_t)psVar4,(sexp)CONCAT17(uVar9,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
        (((sexp)uVar7)->value).type.name = psVar8;
        local_58 = (undefined1  [8])uVar7;
      }
      psVar8 = sexp_append2_op((sexp)ctx_02,(sexp)self_00,uVar11,(sexp)ctx_01,(sexp)self);
      (((anon_union_24768_35_b8e82fc1_for_value *)((long)local_58 + 8))->type).name = psVar8;
      if ((((((anon_union_24768_35_b8e82fc1_for_value *)((long)local_58 + 8))->stack).length & 3) ==
           0) && (((((anon_union_24768_35_b8e82fc1_for_value *)((long)local_58 + 8))->type).name)->
                  tag == 0x13)) {
        uVar3 = (sexp)((anon_union_24768_35_b8e82fc1_for_value *)((long)local_58 + 8))->flonum;
        goto LAB_00152b71;
      }
    }
    if ((((ulong)local_58 & 3) != 0) || (uVar3 = local_58, *(sexp_tag_t *)local_58 != 0x13)) {
      (((sexp)uVar5)->value).type.slots = (sexp)local_58;
      uVar3 = uVar5;
    }
    goto LAB_00152b71;
  }
  psVar6 = (((sexp)local_30)->value).type.name;
  ctx_00 = (psVar6->value).type.cpl;
  if ((((((psVar6->value).type.name)->value).stack.length & 3) == 0) &&
     (((((psVar6->value).type.name)->value).type.name)->tag == 6)) {
    local_28 = (((((psVar6->value).type.name)->value).type.name)->value).type.name;
    sexp_cons_op(psVar8,(sexp)CONCAT17(uVar10,in_stack_ffffffffffffff30),(sexp_sint_t)psVar4,
                 (sexp)CONCAT17(uVar9,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
    psVar6 = sexp_cons_op(psVar8,(sexp)CONCAT17(uVar10,in_stack_ffffffffffffff30),
                          (sexp_sint_t)psVar4,(sexp)CONCAT17(uVar9,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
    (psVar6->value).type.slots =
         (((((((sexp)local_30)->value).type.name)->value).type.name)->value).type.slots;
    local_88 = analyze_lambda((sexp)in_RSI,(sexp)CONCAT44(in_EDX,uVar12),depth_00);
  }
  else {
    local_28 = (((psVar6->value).type.name)->value).type.name;
    local_88 = analyze((sexp)uVar5,(sexp)object,(int)((ulong)uVar7 >> 0x20),(int)uVar7);
  }
  if (((local_88 & 3) == 0) && (uVar3 = local_88, ((sexp)local_88)->tag == 0x13)) goto LAB_00152b71;
  if (((local_88 & 3) == 0) && (((sexp)local_88)->tag == 0x1c)) {
    (((sexp)local_88)->value).type.name = (sexp)local_28;
  }
  uVar3 = analyze_var_ref((sexp)self,value_00,(sexp_conflict *)ls_00);
  if ((((uVar3 & 3) == 0) && (((sexp)uVar3)->tag == 0x13)) ||
     ((uVar3 = sexp_make_set((sexp)CONCAT17(uVar10,in_stack_ffffffffffffff30),psVar4,
                             (sexp)CONCAT17(uVar9,in_stack_ffffffffffffff20)), (uVar3 & 3) == 0 &&
      (((sexp)uVar3)->tag == 0x13)))) goto LAB_00152b71;
  sexp_push_op(psVar4,(sexp_conflict *)CONCAT17(uVar9,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
  if (((local_88 & 3) != 0) || (((sexp)local_88)->tag != 0x1c)) {
    uVar12 = 1;
  }
  psVar6 = sexp_memq_op(ctx_00,(sexp)0x0,2,(sexp)local_28,(((sexp)uVar5)->value).type.dl);
  if (psVar6 == (sexp)&DAT_0000003e) {
    sexp_push_op(psVar4,(sexp_conflict *)CONCAT17(uVar9,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
  }
  local_30 = (((sexp)local_30)->value).type.cpl;
  goto LAB_001526ea;
}

Assistant:

static sexp analyze_lambda (sexp ctx, sexp x, int depth) {
  int trailing_non_procs, verify_duplicates_p;
  sexp name, ls, ctx3;
  sexp_gc_var6(res, body, tmp, value, defs, ctx2);
  sexp_gc_preserve6(ctx, res, body, tmp, value, defs, ctx2);
  /* verify syntax */
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x))))
    sexp_return(res, sexp_compile_error(ctx, "bad lambda syntax", x));
  verify_duplicates_p = sexp_length_unboxed(sexp_cadr(x)) < 100;
  for (ls=sexp_cadr(x); sexp_pairp(ls); ls=sexp_cdr(ls))
    if (! sexp_idp(sexp_car(ls)))
      sexp_return(res, sexp_compile_error(ctx, "non-symbol parameter", x));
    else if (verify_duplicates_p && sexp_truep(sexp_memq(ctx, sexp_car(ls), sexp_cdr(ls))))
      sexp_return(res, sexp_compile_error(ctx, "duplicate parameter", x));
  if (! sexp_nullp(ls)) { /* verify rest param */
    if (! sexp_idp(ls))
      sexp_return(res, sexp_compile_error(ctx, "non-symbol parameter", x));
    else if (sexp_truep(sexp_memq(ctx, ls, sexp_cadr(x))))
      sexp_return(res, sexp_compile_error(ctx, "duplicate parameter", x));
  }
  /* build lambda and analyze body */
  res = sexp_make_lambda(ctx, tmp=sexp_copy_list(ctx, sexp_cadr(x)));
  if (sexp_exceptionp(res)) sexp_return(res, res);
  sexp_lambda_source(res) = sexp_pair_source(x);
  if (! (sexp_lambda_source(res) && sexp_pairp(sexp_lambda_source(res))))
    sexp_lambda_source(res) = sexp_pair_source(sexp_cdr(x));
  if (! (sexp_lambda_source(res) && sexp_pairp(sexp_lambda_source(res))))
    sexp_lambda_source(res) = sexp_pair_source(sexp_cddr(x));
  ctx2 = sexp_make_child_context(ctx, res);
  if (sexp_exceptionp(ctx2)) sexp_return(res, ctx2);
  tmp = sexp_flatten_dot(ctx2, sexp_lambda_params(res));
  sexp_context_env(ctx2) = sexp_extend_env(ctx2, sexp_context_env(ctx2), tmp, res);
  if (sexp_exceptionp(sexp_context_env(ctx2))) sexp_return(res, sexp_context_env(ctx2));
  sexp_env_lambda(sexp_context_env(ctx2)) = res;
  body = analyze_seq(ctx2, sexp_cddr(x), depth, 1);
  if (sexp_exceptionp(body)) sexp_return(res, body);
  /* delayed analyze internal defines */
  trailing_non_procs = 0;
  defs = SEXP_NULL;
  for (ls=sexp_lambda_defs(res); sexp_pairp(ls); ls=sexp_cdr(ls)) {
    tmp = sexp_car(ls);
    ctx3 = sexp_cdr(tmp);
    if (sexp_pairp(sexp_caar(tmp))) {
      name = sexp_caaar(tmp);
      tmp = sexp_cons(ctx3, sexp_cdaar(tmp), sexp_cdar(tmp));
      tmp = sexp_cons(ctx3, SEXP_VOID, tmp);
      sexp_pair_source(tmp) = sexp_pair_source(sexp_caar(ls));
      value = analyze_lambda(ctx3, tmp, depth);
    } else {
      name = sexp_caar(tmp);
      value = analyze(ctx3, sexp_cadar(tmp), depth, 0);
    }
    if (sexp_exceptionp(value)) sexp_return(res, value);
    if (sexp_lambdap(value)) sexp_lambda_name(value) = name;
    tmp = analyze_var_ref(ctx3, name, NULL);
    if (sexp_exceptionp(tmp)) sexp_return(res, tmp);
    tmp = sexp_make_set(ctx3, tmp, value);
    if (sexp_exceptionp(tmp)) sexp_return(res, tmp);
    sexp_push(ctx3, defs, tmp);
    if (!sexp_lambdap(value)) trailing_non_procs = 1;
    if (trailing_non_procs || !SEXP_USE_UNBOXED_LOCALS)
      sexp_insert(ctx3, sexp_lambda_sv(res), name);
  }
  if (sexp_pairp(defs)) {
    if (! sexp_seqp(body)) {
      tmp = sexp_alloc_type(ctx2, seq, SEXP_SEQ);
      sexp_seq_ls(tmp) = sexp_list1(ctx2, body);
      body = tmp;
    }
    sexp_seq_ls(body) = sexp_append2(ctx2, defs, sexp_seq_ls(body));
    if (sexp_exceptionp(sexp_seq_ls(body))) sexp_return(res, sexp_seq_ls(body));
  }
  if (sexp_exceptionp(body)) res = body;
  else sexp_lambda_body(res) = body;
 cleanup:
  sexp_gc_release6(ctx);
  return res;
}